

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

void __thiscall
gl4cts::GLSL420Pack::TestBase::initShaderSource
          (TestBase *this,SHADER_STAGES in_stage,bool in_use_version_400,shaderSource *out_source)

{
  pointer psVar1;
  uint in_EAX;
  GLint *pGVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  long lVar4;
  bool use_lengths;
  GLuint n_parts;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)(in_EAX & 0xffffff);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,(long)&uStack_38 + 4,(long)&uStack_38 + 3);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::resize(&out_source->m_parts,uStack_38 >> 0x20);
  out_source->m_use_lengths = (bool)uStack_38._3_1_;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
            (this,(ulong)in_stage,CONCAT71(in_register_00000011,in_use_version_400) & 0xffffffff);
  if (uStack_38._3_1_ == '\0') {
    if (uStack_38._4_4_ != 0) {
      pGVar2 = &((out_source->m_parts).
                 super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_length;
      uVar3 = 0;
      do {
        *pGVar2 = 0;
        uVar3 = uVar3 + 1;
        pGVar2 = pGVar2 + 10;
      } while (uVar3 < uStack_38._4_4_);
    }
  }
  else if (uStack_38._4_4_ != 0) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      psVar1 = (out_source->m_parts).
               super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)((long)&psVar1->m_length + lVar4) =
           *(undefined4 *)((long)&(psVar1->m_code)._M_string_length + lVar4);
      std::__cxx11::string::append((char *)((long)&(psVar1->m_code)._M_dataplus._M_p + lVar4));
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x28;
    } while (uVar3 < uStack_38 >> 0x20);
  }
  return;
}

Assistant:

void TestBase::initShaderSource(Utils::SHADER_STAGES in_stage, bool in_use_version_400, Utils::shaderSource& out_source)
{
	/* Shader source configuration */
	glw::GLuint n_parts		= 0;
	bool		use_lengths = false;

	getShaderSourceConfig(n_parts, use_lengths);

	out_source.m_parts.resize(n_parts);
	out_source.m_use_lengths = use_lengths;

	/* Request child class to prepare shader sources */
	prepareShaderSource(in_stage, in_use_version_400, out_source);

	/* Prepare source lengths */
	if (true == use_lengths)
	{
		for (GLuint i = 0; i < n_parts; ++i)
		{
			out_source.m_parts[i].m_length = static_cast<glw::GLint>(out_source.m_parts[i].m_code.length());

			out_source.m_parts[i].m_code.append("This should be ignored by compiler, as source length is provided");
		}
	}
	else
	{
		for (GLuint i = 0; i < n_parts; ++i)
		{
			out_source.m_parts[i].m_length = 0;
		}
	}
}